

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
trng::impl::operator>>(basic_istream<char,_std::char_traits<char>_> *in,uint128 *value)

{
  uint128 uVar1;
  uint128 uVar2;
  uint128 uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int_type c;
  ulong uVar8;
  bool bVar9;
  uint128 uVar10;
  uint128 result;
  anon_class_1_0_00000001 hex_digit_to_uint128;
  
  uVar5 = *(uint *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  std::ws<char,std::char_traits<char>>((istream *)in);
  uVar4 = std::istream::peek();
  uVar3.m_hi = result.m_hi;
  uVar3.m_lo = result.m_lo;
  uVar1.m_hi = result.m_hi;
  uVar1.m_lo = result.m_lo;
  uVar10.m_hi = result.m_hi;
  uVar10.m_lo = result.m_lo;
  if ((uVar5 & 0x4a) == 8) {
    if ((uVar4 - 0x30 < 10) ||
       ((uVar4 - 0x41 < 0x26 &&
        (result = uVar3, (0x3f0000003fU >> ((ulong)(uVar4 - 0x41) & 0x3f) & 1) != 0)))) {
      result = (uint128)ZEXT816(0);
      iVar6 = 1;
      do {
        iVar7 = std::istream::peek();
        if ((iVar7 - 0x30U < 10) ||
           ((iVar7 - 0x41U < 0x26 && ((0x3f0000003fU >> ((ulong)(iVar7 - 0x41U) & 0x3f) & 1) != 0)))
           ) {
          if (iVar6 == 0) goto LAB_00256c51;
LAB_00256c6b:
          if (result.m_hi >> 0x3c != 0) break;
          portable_impl::uint128::operator*=(&result,(uint128)ZEXT816(0x10));
          c = std::istream::get();
          uVar10 = operator>><char,_std::char_traits<char>,_trng::portable_impl::uint128>::
                   anon_class_1_0_00000001::operator()(&hex_digit_to_uint128,c);
          result = (uint128)((undefined1  [16])uVar10 + (undefined1  [16])result);
        }
        else {
          if (iVar6 != 0) {
LAB_00256cbc:
            *value = result;
            return in;
          }
          uVar5 = std::istream::peek();
          if ((uVar5 & 0xffffffdf) != 0x58) goto LAB_00256cbc;
LAB_00256c51:
          uVar5 = std::istream::peek();
          if ((uVar5 & 0xffffffdf) != 0x58) goto LAB_00256c6b;
          std::istream::get();
        }
        iVar6 = iVar6 + -1;
      } while( true );
    }
  }
  else if ((uVar5 & 0x4a) == 0x40) {
    result = uVar10;
    if ((uVar4 & 0xfffffff8) == 0x30) {
      result.m_lo = 0;
      result.m_hi = 0;
      while( true ) {
        uVar5 = std::istream::peek();
        if ((uVar5 & 0xfffffff8) != 0x30) {
          value->m_lo = result.m_lo;
          value->m_hi = result.m_hi;
          return in;
        }
        if (result.m_hi >> 0x3d != 0) break;
        portable_impl::uint128::operator*=(&result,(uint128)ZEXT816(8));
        iVar6 = std::istream::get();
        bVar9 = CARRY8(result.m_lo,(long)(iVar6 + -0x30));
        result.m_lo = result.m_lo + (long)(iVar6 + -0x30);
        result.m_hi = result.m_hi + bVar9;
      }
    }
  }
  else {
    result = uVar1;
    if (uVar4 - 0x30 < 10) {
      result.m_lo = 0;
      result.m_hi = 0;
      while( true ) {
        iVar6 = std::istream::peek();
        uVar2.m_hi = result.m_hi;
        uVar2.m_lo = result.m_lo;
        if (9 < iVar6 - 0x30U) {
          value->m_lo = result.m_lo;
          value->m_hi = result.m_hi;
          return in;
        }
        if ((0x1999999999999999 < result.m_hi) ||
           ((result.m_hi == 0x1999999999999999 && (result = uVar2, 0x9999999999999999 < result.m_lo)
            ))) break;
        portable_impl::uint128::operator*=(&result,(uint128)ZEXT816(10));
        iVar6 = std::istream::get();
        uVar8 = (ulong)(iVar6 + -0x30);
        if (result.m_hi == 0xffffffffffffffff && CARRY8(result.m_lo,uVar8)) break;
        bVar9 = CARRY8(result.m_lo,uVar8);
        result.m_lo = result.m_lo + uVar8;
        result.m_hi = result.m_hi + bVar9;
      }
    }
  }
  std::ios::setstate((int)*(undefined8 *)(*(long *)in + -0x18) + (int)in);
  return in;
}

Assistant:

std::basic_istream<T,
        TRAIT> &operator>>(std::basic_istream<T,
        TRAIT> &in, UINT128 &value) {
      const auto stream_flags{in.flags()};

      const auto is_dec_digit = [](typename TRAIT::int_type c) -> bool {
        return T('0') <= c and c <= T('9');
      };
      const auto dec_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
      };

      const auto is_oct_digit = [](typename TRAIT::int_type c) -> bool {
        return T('0') <= c and c <= T('7');
      };
      const auto oct_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
      };

      const auto is_hex_digit = [](typename TRAIT::int_type c) -> bool {
        return (T('0') <= c and c <= T('9')) or (T('a') <= c and c <= T('f')) or
               (T('A') <= c and c <= T('F'));
      };
      const auto is_hex_basechar = [](typename TRAIT::int_type c) -> bool {
        return c == T('x') or c == T('X');
      };
      const auto hex_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        if (T('0') <= c and c <= T('9'))
          return static_cast<UINT128>(
              static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
        if (T('a') <= c and c <= T('f'))
          return static_cast<UINT128>(
              static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('a') + 10));
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('A') + 10));
      };

      in >> std::ws;

      switch (stream_flags & std::ios_base::basefield) {
        case std::ios_base::oct: {
          const UINT128 mult_overflow{0x2000000000000000, 0x000000000000000};  // 2^128 / 8
          if (not is_oct_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          while (is_oct_digit(in.peek())) {
            if (result >= mult_overflow) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result *= static_cast<UINT128>(static_cast<std::uint64_t>(8));
            result += oct_digit_to_uint128(in.get());
          }
          value = result;
        }
          break;
        case std::ios_base::dec:
        default: {
          const UINT128 mult_overflow{0x1999999999999999,
                                      0x999999999999999a};  // ceil(2^128 / 10)
          const UINT128 max{0xffffffffffffffff, 0xffffffffffffffff};  // 2^128 - 1
          if (not is_dec_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          while (is_dec_digit(in.peek())) {
            if (result >= mult_overflow) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result *= static_cast<UINT128>(static_cast<std::uint64_t>(10));
            const auto next_digit{dec_digit_to_uint128(in.get())};
            if (next_digit > max - result) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result += next_digit;
          }
          value = result;
        }
          break;
        case std::ios_base::hex: {
          const UINT128 mult_overflow{0x1000000000000000, 0x000000000000000};  // 2^128 / 16
          if (not is_hex_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          int pos{0};
          while (is_hex_digit(in.peek()) or (pos == 1 and is_hex_basechar(in.peek()))) {
            if (pos == 1 and is_hex_basechar(in.peek())) {
              in.get();
            } else {
              if (result >= mult_overflow) {
                in.setstate(std::ios_base::failbit);
                return in;
              }
              result *= static_cast<UINT128>(static_cast<std::uint64_t>(16));
              result += hex_digit_to_uint128(in.get());
            }
            ++pos;
          }
          value = result;
        }
          break;
      }

      return in;
    }